

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  long lVar44;
  ulong uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  ulong uVar66;
  long lVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  float fVar97;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [64];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1870;
  ulong *local_1868;
  undefined1 local_1820 [16];
  undefined1 (*local_1810) [16];
  long local_1808;
  long local_1800;
  ulong local_17f8;
  RTCFilterFunctionNArguments local_17f0;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined4 local_15f0;
  undefined4 uStack_15ec;
  undefined4 uStack_15e8;
  undefined4 uStack_15e4;
  undefined1 local_15e0 [16];
  undefined1 local_15d0 [16];
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined1 local_15b0 [16];
  undefined4 local_15a0;
  undefined4 uStack_159c;
  undefined4 uStack_1598;
  undefined4 uStack_1594;
  undefined1 local_1590 [16];
  uint local_1580;
  uint uStack_157c;
  uint uStack_1578;
  uint uStack_1574;
  uint uStack_1570;
  uint uStack_156c;
  uint uStack_1568;
  uint uStack_1564;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined4 uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1868 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1680._4_4_ = uVar1;
  local_1680._0_4_ = uVar1;
  local_1680._8_4_ = uVar1;
  local_1680._12_4_ = uVar1;
  local_1680._16_4_ = uVar1;
  local_1680._20_4_ = uVar1;
  local_1680._24_4_ = uVar1;
  local_1680._28_4_ = uVar1;
  auVar108 = ZEXT3264(local_1680);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_16a0._4_4_ = uVar1;
  local_16a0._0_4_ = uVar1;
  local_16a0._8_4_ = uVar1;
  local_16a0._12_4_ = uVar1;
  local_16a0._16_4_ = uVar1;
  local_16a0._20_4_ = uVar1;
  local_16a0._24_4_ = uVar1;
  local_16a0._28_4_ = uVar1;
  auVar110 = ZEXT3264(local_16a0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_16c0._4_4_ = uVar1;
  local_16c0._0_4_ = uVar1;
  local_16c0._8_4_ = uVar1;
  local_16c0._12_4_ = uVar1;
  local_16c0._16_4_ = uVar1;
  local_16c0._20_4_ = uVar1;
  local_16c0._24_4_ = uVar1;
  local_16c0._28_4_ = uVar1;
  auVar115 = ZEXT3264(local_16c0);
  fVar111 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar117 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar118 = fVar111 * 0.99999964;
  fVar119 = fVar116 * 0.99999964;
  fVar120 = fVar117 * 0.99999964;
  fVar111 = fVar111 * 1.0000004;
  fVar116 = fVar116 * 1.0000004;
  fVar117 = fVar117 * 1.0000004;
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_17f8 = uVar69 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_1640._4_4_ = iVar2;
  local_1640._0_4_ = iVar2;
  local_1640._8_4_ = iVar2;
  local_1640._12_4_ = iVar2;
  local_1640._16_4_ = iVar2;
  local_1640._20_4_ = iVar2;
  local_1640._24_4_ = iVar2;
  local_1640._28_4_ = iVar2;
  auVar91 = ZEXT3264(local_1640);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1660._4_4_ = iVar2;
  local_1660._0_4_ = iVar2;
  local_1660._8_4_ = iVar2;
  local_1660._12_4_ = iVar2;
  local_1660._16_4_ = iVar2;
  local_1660._20_4_ = iVar2;
  local_1660._24_4_ = iVar2;
  local_1660._28_4_ = iVar2;
  auVar96 = ZEXT3264(local_1660);
  local_1540._16_16_ = mm_lookupmask_ps._240_16_;
  local_1540._0_16_ = mm_lookupmask_ps._0_16_;
  local_1810 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = 0x3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar83._16_4_ = 0x3f800000;
  auVar83._20_4_ = 0x3f800000;
  auVar83._24_4_ = 0x3f800000;
  auVar83._28_4_ = 0x3f800000;
  auVar73._8_4_ = 0xbf800000;
  auVar73._0_8_ = 0xbf800000bf800000;
  auVar73._12_4_ = 0xbf800000;
  auVar73._16_4_ = 0xbf800000;
  auVar73._20_4_ = 0xbf800000;
  auVar73._24_4_ = 0xbf800000;
  auVar73._28_4_ = 0xbf800000;
  _local_1560 = vblendvps_avx(auVar83,auVar73,local_1540);
  fVar121 = fVar118;
  fVar124 = fVar118;
  fVar125 = fVar118;
  fVar126 = fVar118;
  fVar127 = fVar118;
  fVar128 = fVar118;
  fVar131 = fVar119;
  fVar132 = fVar119;
  fVar133 = fVar119;
  fVar134 = fVar119;
  fVar135 = fVar119;
  fVar136 = fVar119;
  fVar137 = fVar120;
  fVar138 = fVar120;
  fVar139 = fVar120;
  fVar140 = fVar120;
  fVar141 = fVar120;
  fVar142 = fVar120;
  fVar144 = fVar111;
  fVar145 = fVar111;
  fVar146 = fVar111;
  fVar147 = fVar111;
  fVar148 = fVar111;
  fVar149 = fVar111;
  fVar151 = fVar116;
  fVar152 = fVar116;
  fVar153 = fVar116;
  fVar154 = fVar116;
  fVar155 = fVar116;
  fVar156 = fVar116;
  fVar158 = fVar117;
  fVar159 = fVar117;
  fVar160 = fVar117;
  fVar161 = fVar117;
  fVar162 = fVar117;
  fVar163 = fVar117;
  local_1780 = fVar117;
  fStack_177c = fVar117;
  fStack_1778 = fVar117;
  fStack_1774 = fVar117;
  fStack_1770 = fVar117;
  fStack_176c = fVar117;
  fStack_1768 = fVar117;
  fStack_1764 = fVar117;
  local_1760 = fVar116;
  fStack_175c = fVar116;
  fStack_1758 = fVar116;
  fStack_1754 = fVar116;
  fStack_1750 = fVar116;
  fStack_174c = fVar116;
  fStack_1748 = fVar116;
  fStack_1744 = fVar116;
  local_1740 = fVar111;
  fStack_173c = fVar111;
  fStack_1738 = fVar111;
  fStack_1734 = fVar111;
  fStack_1730 = fVar111;
  fStack_172c = fVar111;
  fStack_1728 = fVar111;
  fStack_1724 = fVar111;
  local_1720 = fVar120;
  fStack_171c = fVar120;
  fStack_1718 = fVar120;
  fStack_1714 = fVar120;
  fStack_1710 = fVar120;
  fStack_170c = fVar120;
  fStack_1708 = fVar120;
  fStack_1704 = fVar120;
  local_1700 = fVar119;
  fStack_16fc = fVar119;
  fStack_16f8 = fVar119;
  fStack_16f4 = fVar119;
  fStack_16f0 = fVar119;
  fStack_16ec = fVar119;
  fStack_16e8 = fVar119;
  fStack_16e4 = fVar119;
  local_16e0 = fVar118;
  fStack_16dc = fVar118;
  fStack_16d8 = fVar118;
  fStack_16d4 = fVar118;
  fStack_16d0 = fVar118;
  fStack_16cc = fVar118;
  fStack_16c8 = fVar118;
  fStack_16c4 = fVar118;
  do {
    if (local_1868 == &local_1200) {
LAB_0167f606:
      return local_1868 != &local_1200;
    }
    local_1870 = local_1868 + -1;
    uVar72 = local_1868[-1];
    while ((uVar72 & 8) == 0) {
      auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar69),auVar108._0_32_);
      auVar81._4_4_ = fVar121 * auVar73._4_4_;
      auVar81._0_4_ = fVar118 * auVar73._0_4_;
      auVar81._8_4_ = fVar124 * auVar73._8_4_;
      auVar81._12_4_ = fVar125 * auVar73._12_4_;
      auVar81._16_4_ = fVar126 * auVar73._16_4_;
      auVar81._20_4_ = fVar127 * auVar73._20_4_;
      auVar81._24_4_ = fVar128 * auVar73._24_4_;
      auVar81._28_4_ = auVar73._28_4_;
      auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar71),auVar110._0_32_);
      auVar43._4_4_ = fVar131 * auVar73._4_4_;
      auVar43._0_4_ = fVar119 * auVar73._0_4_;
      auVar43._8_4_ = fVar132 * auVar73._8_4_;
      auVar43._12_4_ = fVar133 * auVar73._12_4_;
      auVar43._16_4_ = fVar134 * auVar73._16_4_;
      auVar43._20_4_ = fVar135 * auVar73._20_4_;
      auVar43._24_4_ = fVar136 * auVar73._24_4_;
      auVar43._28_4_ = auVar73._28_4_;
      auVar73 = vmaxps_avx(auVar81,auVar43);
      auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar70),auVar115._0_32_);
      auVar32._4_4_ = fVar137 * auVar83._4_4_;
      auVar32._0_4_ = fVar120 * auVar83._0_4_;
      auVar32._8_4_ = fVar138 * auVar83._8_4_;
      auVar32._12_4_ = fVar139 * auVar83._12_4_;
      auVar32._16_4_ = fVar140 * auVar83._16_4_;
      auVar32._20_4_ = fVar141 * auVar83._20_4_;
      auVar32._24_4_ = fVar142 * auVar83._24_4_;
      auVar32._28_4_ = auVar83._28_4_;
      auVar83 = vmaxps_avx(auVar32,auVar91._0_32_);
      auVar73 = vmaxps_avx(auVar73,auVar83);
      auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + local_17f8),auVar108._0_32_);
      auVar33._4_4_ = fVar144 * auVar83._4_4_;
      auVar33._0_4_ = fVar111 * auVar83._0_4_;
      auVar33._8_4_ = fVar145 * auVar83._8_4_;
      auVar33._12_4_ = fVar146 * auVar83._12_4_;
      auVar33._16_4_ = fVar147 * auVar83._16_4_;
      auVar33._20_4_ = fVar148 * auVar83._20_4_;
      auVar33._24_4_ = fVar149 * auVar83._24_4_;
      auVar33._28_4_ = auVar83._28_4_;
      auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar71 ^ 0x20)),auVar110._0_32_);
      auVar34._4_4_ = fVar151 * auVar83._4_4_;
      auVar34._0_4_ = fVar116 * auVar83._0_4_;
      auVar34._8_4_ = fVar152 * auVar83._8_4_;
      auVar34._12_4_ = fVar153 * auVar83._12_4_;
      auVar34._16_4_ = fVar154 * auVar83._16_4_;
      auVar34._20_4_ = fVar155 * auVar83._20_4_;
      auVar34._24_4_ = fVar156 * auVar83._24_4_;
      auVar34._28_4_ = auVar83._28_4_;
      auVar83 = vminps_avx(auVar33,auVar34);
      auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar70 ^ 0x20)),auVar115._0_32_);
      auVar35._4_4_ = fVar158 * auVar81._4_4_;
      auVar35._0_4_ = fVar117 * auVar81._0_4_;
      auVar35._8_4_ = fVar159 * auVar81._8_4_;
      auVar35._12_4_ = fVar160 * auVar81._12_4_;
      auVar35._16_4_ = fVar161 * auVar81._16_4_;
      auVar35._20_4_ = fVar162 * auVar81._20_4_;
      auVar35._24_4_ = fVar163 * auVar81._24_4_;
      auVar35._28_4_ = auVar81._28_4_;
      auVar81 = vminps_avx(auVar35,auVar96._0_32_);
      auVar83 = vminps_avx(auVar83,auVar81);
      auVar73 = vcmpps_avx(auVar73,auVar83,2);
      uVar65 = vmovmskps_avx(auVar73);
      if (uVar65 == 0) goto LAB_0167f5db;
      uVar65 = uVar65 & 0xff;
      uVar66 = uVar72 & 0xfffffffffffffff0;
      lVar44 = 0;
      for (uVar72 = (ulong)uVar65; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar44 = lVar44 + 1;
      }
      uVar72 = *(ulong *)(uVar66 + lVar44 * 8);
      uVar65 = uVar65 - 1 & uVar65;
      uVar68 = (ulong)uVar65;
      if (uVar65 != 0) {
        do {
          *local_1870 = uVar72;
          local_1870 = local_1870 + 1;
          lVar44 = 0;
          for (uVar72 = uVar68; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
            lVar44 = lVar44 + 1;
          }
          uVar68 = uVar68 - 1 & uVar68;
          uVar72 = *(ulong *)(uVar66 + lVar44 * 8);
        } while (uVar68 != 0);
      }
    }
    local_1800 = (ulong)((uint)uVar72 & 0xf) - 8;
    uVar72 = uVar72 & 0xfffffffffffffff0;
    for (local_1808 = 0; local_1808 != local_1800; local_1808 = local_1808 + 1) {
      lVar67 = local_1808 * 0x60;
      pSVar3 = context->scene;
      ppfVar4 = (pSVar3->vertices).items;
      pfVar5 = ppfVar4[*(uint *)(uVar72 + 0x40 + lVar67)];
      auVar84._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x20 + lVar67));
      auVar84._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + lVar67));
      pfVar6 = ppfVar4[*(uint *)(uVar72 + 0x48 + lVar67)];
      auVar86._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x28 + lVar67));
      auVar86._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 8 + lVar67));
      pfVar7 = ppfVar4[*(uint *)(uVar72 + 0x44 + lVar67)];
      auVar98._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x24 + lVar67));
      auVar98._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 4 + lVar67));
      pfVar8 = ppfVar4[*(uint *)(uVar72 + 0x4c + lVar67)];
      auVar112._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x2c + lVar67));
      auVar112._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0xc + lVar67));
      lVar44 = uVar72 + 0x40 + lVar67;
      local_13e0 = *(undefined8 *)(lVar44 + 0x10);
      uStack_13d8 = *(undefined8 *)(lVar44 + 0x18);
      uStack_13d0 = local_13e0;
      uStack_13c8 = uStack_13d8;
      lVar44 = uVar72 + 0x50 + lVar67;
      local_1400 = *(undefined8 *)(lVar44 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar44 + 0x18);
      auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x10 + lVar67)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x18 + lVar67)));
      auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x10 + lVar67)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x18 + lVar67)));
      auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x14 + lVar67)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x1c + lVar67)));
      auVar76 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x14 + lVar67)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x1c + lVar67)));
      auVar39 = vunpcklps_avx(auVar37,auVar76);
      auVar40 = vunpcklps_avx(auVar82,auVar38);
      auVar37 = vunpckhps_avx(auVar82,auVar38);
      auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x30 + lVar67)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x38 + lVar67)));
      auVar76 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x30 + lVar67)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x38 + lVar67)));
      auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x34 + lVar67)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x3c + lVar67)));
      auVar82 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x34 + lVar67)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x3c + lVar67)));
      auVar82 = vunpcklps_avx(auVar76,auVar82);
      auVar42 = vunpcklps_avx(auVar38,auVar41);
      auVar76 = vunpckhps_avx(auVar38,auVar41);
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      auVar73 = vunpcklps_avx(auVar98,auVar112);
      auVar83 = vunpcklps_avx(auVar84,auVar86);
      auVar43 = vunpcklps_avx(auVar83,auVar73);
      auVar73 = vunpckhps_avx(auVar83,auVar73);
      auVar83 = vunpckhps_avx(auVar98,auVar112);
      auVar81 = vunpckhps_avx(auVar84,auVar86);
      auVar83 = vunpcklps_avx(auVar81,auVar83);
      auVar87._16_16_ = auVar40;
      auVar87._0_16_ = auVar40;
      auVar99._16_16_ = auVar37;
      auVar99._0_16_ = auVar37;
      auVar77._16_16_ = auVar39;
      auVar77._0_16_ = auVar39;
      auVar157._16_16_ = auVar42;
      auVar157._0_16_ = auVar42;
      auVar92._16_16_ = auVar76;
      auVar92._0_16_ = auVar76;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar113._4_4_ = uVar1;
      auVar113._0_4_ = uVar1;
      auVar113._8_4_ = uVar1;
      auVar113._12_4_ = uVar1;
      auVar113._16_4_ = uVar1;
      auVar113._20_4_ = uVar1;
      auVar113._24_4_ = uVar1;
      auVar113._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar129._4_4_ = uVar1;
      auVar129._0_4_ = uVar1;
      auVar129._8_4_ = uVar1;
      auVar129._12_4_ = uVar1;
      auVar129._16_4_ = uVar1;
      auVar129._20_4_ = uVar1;
      auVar129._24_4_ = uVar1;
      auVar129._28_4_ = uVar1;
      auVar74._16_16_ = auVar82;
      auVar74._0_16_ = auVar82;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar143._4_4_ = uVar1;
      auVar143._0_4_ = uVar1;
      auVar143._8_4_ = uVar1;
      auVar143._12_4_ = uVar1;
      auVar143._16_4_ = uVar1;
      auVar143._20_4_ = uVar1;
      auVar143._24_4_ = uVar1;
      auVar143._28_4_ = uVar1;
      local_17a0 = vsubps_avx(auVar43,auVar113);
      auVar43 = vsubps_avx(auVar73,auVar129);
      local_17c0 = vsubps_avx(auVar83,auVar143);
      auVar73 = vsubps_avx(auVar87,auVar113);
      auVar83 = vsubps_avx(auVar99,auVar129);
      auVar81 = vsubps_avx(auVar77,auVar143);
      auVar32 = vsubps_avx(auVar157,auVar113);
      auVar33 = vsubps_avx(auVar92,auVar129);
      auVar34 = vsubps_avx(auVar74,auVar143);
      local_1420 = vsubps_avx(auVar32,local_17a0);
      local_1460 = vsubps_avx(auVar33,auVar43);
      local_1440 = vsubps_avx(auVar34,local_17c0);
      auVar75._0_4_ = local_17a0._0_4_ + auVar32._0_4_;
      auVar75._4_4_ = local_17a0._4_4_ + auVar32._4_4_;
      auVar75._8_4_ = local_17a0._8_4_ + auVar32._8_4_;
      auVar75._12_4_ = local_17a0._12_4_ + auVar32._12_4_;
      auVar75._16_4_ = local_17a0._16_4_ + auVar32._16_4_;
      auVar75._20_4_ = local_17a0._20_4_ + auVar32._20_4_;
      auVar75._24_4_ = local_17a0._24_4_ + auVar32._24_4_;
      auVar75._28_4_ = local_17a0._28_4_ + auVar32._28_4_;
      auVar85._0_4_ = auVar43._0_4_ + auVar33._0_4_;
      auVar85._4_4_ = auVar43._4_4_ + auVar33._4_4_;
      auVar85._8_4_ = auVar43._8_4_ + auVar33._8_4_;
      auVar85._12_4_ = auVar43._12_4_ + auVar33._12_4_;
      auVar85._16_4_ = auVar43._16_4_ + auVar33._16_4_;
      auVar85._20_4_ = auVar43._20_4_ + auVar33._20_4_;
      auVar85._24_4_ = auVar43._24_4_ + auVar33._24_4_;
      auVar85._28_4_ = auVar43._28_4_ + auVar33._28_4_;
      fVar11 = local_17c0._0_4_;
      auVar93._0_4_ = auVar34._0_4_ + fVar11;
      fVar12 = local_17c0._4_4_;
      auVar93._4_4_ = auVar34._4_4_ + fVar12;
      fVar13 = local_17c0._8_4_;
      auVar93._8_4_ = auVar34._8_4_ + fVar13;
      fVar14 = local_17c0._12_4_;
      auVar93._12_4_ = auVar34._12_4_ + fVar14;
      fVar15 = local_17c0._16_4_;
      auVar93._16_4_ = auVar34._16_4_ + fVar15;
      fVar16 = local_17c0._20_4_;
      auVar93._20_4_ = auVar34._20_4_ + fVar16;
      fVar17 = local_17c0._24_4_;
      auVar93._24_4_ = auVar34._24_4_ + fVar17;
      fVar111 = local_17c0._28_4_;
      auVar93._28_4_ = auVar34._28_4_ + fVar111;
      auVar36._4_4_ = local_1440._4_4_ * auVar85._4_4_;
      auVar36._0_4_ = local_1440._0_4_ * auVar85._0_4_;
      auVar36._8_4_ = local_1440._8_4_ * auVar85._8_4_;
      auVar36._12_4_ = local_1440._12_4_ * auVar85._12_4_;
      auVar36._16_4_ = local_1440._16_4_ * auVar85._16_4_;
      auVar36._20_4_ = local_1440._20_4_ * auVar85._20_4_;
      auVar36._24_4_ = local_1440._24_4_ * auVar85._24_4_;
      auVar36._28_4_ = uVar1;
      auVar76 = vfmsub231ps_fma(auVar36,local_1460,auVar93);
      auVar46._4_4_ = local_1420._4_4_ * auVar93._4_4_;
      auVar46._0_4_ = local_1420._0_4_ * auVar93._0_4_;
      auVar46._8_4_ = local_1420._8_4_ * auVar93._8_4_;
      auVar46._12_4_ = local_1420._12_4_ * auVar93._12_4_;
      auVar46._16_4_ = local_1420._16_4_ * auVar93._16_4_;
      auVar46._20_4_ = local_1420._20_4_ * auVar93._20_4_;
      auVar46._24_4_ = local_1420._24_4_ * auVar93._24_4_;
      auVar46._28_4_ = auVar93._28_4_;
      auVar37 = vfmsub231ps_fma(auVar46,local_1440,auVar75);
      auVar47._4_4_ = local_1460._4_4_ * auVar75._4_4_;
      auVar47._0_4_ = local_1460._0_4_ * auVar75._0_4_;
      auVar47._8_4_ = local_1460._8_4_ * auVar75._8_4_;
      auVar47._12_4_ = local_1460._12_4_ * auVar75._12_4_;
      auVar47._16_4_ = local_1460._16_4_ * auVar75._16_4_;
      auVar47._20_4_ = local_1460._20_4_ * auVar75._20_4_;
      auVar47._24_4_ = local_1460._24_4_ * auVar75._24_4_;
      auVar47._28_4_ = auVar75._28_4_;
      auVar82 = vfmsub231ps_fma(auVar47,local_1420,auVar85);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar130._4_4_ = uVar1;
      auVar130._0_4_ = uVar1;
      auVar130._8_4_ = uVar1;
      auVar130._12_4_ = uVar1;
      auVar130._16_4_ = uVar1;
      auVar130._20_4_ = uVar1;
      auVar130._24_4_ = uVar1;
      auVar130._28_4_ = uVar1;
      local_14a0 = *(float *)(ray + k * 4 + 0x60);
      auVar48._4_4_ = local_14a0 * auVar82._4_4_;
      auVar48._0_4_ = local_14a0 * auVar82._0_4_;
      auVar48._8_4_ = local_14a0 * auVar82._8_4_;
      auVar48._12_4_ = local_14a0 * auVar82._12_4_;
      auVar48._16_4_ = local_14a0 * 0.0;
      auVar48._20_4_ = local_14a0 * 0.0;
      auVar48._24_4_ = local_14a0 * 0.0;
      auVar48._28_4_ = auVar85._28_4_;
      auVar37 = vfmadd231ps_fma(auVar48,auVar130,ZEXT1632(auVar37));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_1480._4_4_ = uVar1;
      local_1480._0_4_ = uVar1;
      local_1480._8_4_ = uVar1;
      local_1480._12_4_ = uVar1;
      local_1480._16_4_ = uVar1;
      local_1480._20_4_ = uVar1;
      local_1480._24_4_ = uVar1;
      local_1480._28_4_ = uVar1;
      auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),local_1480,ZEXT1632(auVar76));
      local_14c0 = vsubps_avx(auVar43,auVar83);
      local_14e0 = vsubps_avx(local_17c0,auVar81);
      auVar150._0_4_ = auVar43._0_4_ + auVar83._0_4_;
      auVar150._4_4_ = auVar43._4_4_ + auVar83._4_4_;
      auVar150._8_4_ = auVar43._8_4_ + auVar83._8_4_;
      auVar150._12_4_ = auVar43._12_4_ + auVar83._12_4_;
      auVar150._16_4_ = auVar43._16_4_ + auVar83._16_4_;
      auVar150._20_4_ = auVar43._20_4_ + auVar83._20_4_;
      auVar150._24_4_ = auVar43._24_4_ + auVar83._24_4_;
      auVar150._28_4_ = auVar43._28_4_ + auVar83._28_4_;
      auVar94._0_4_ = fVar11 + auVar81._0_4_;
      auVar94._4_4_ = fVar12 + auVar81._4_4_;
      auVar94._8_4_ = fVar13 + auVar81._8_4_;
      auVar94._12_4_ = fVar14 + auVar81._12_4_;
      auVar94._16_4_ = fVar15 + auVar81._16_4_;
      auVar94._20_4_ = fVar16 + auVar81._20_4_;
      auVar94._24_4_ = fVar17 + auVar81._24_4_;
      fVar116 = auVar81._28_4_;
      auVar94._28_4_ = fVar111 + fVar116;
      fVar97 = local_14e0._0_4_;
      fVar103 = local_14e0._4_4_;
      auVar49._4_4_ = auVar150._4_4_ * fVar103;
      auVar49._0_4_ = auVar150._0_4_ * fVar97;
      fVar106 = local_14e0._8_4_;
      auVar49._8_4_ = auVar150._8_4_ * fVar106;
      fVar20 = local_14e0._12_4_;
      auVar49._12_4_ = auVar150._12_4_ * fVar20;
      fVar23 = local_14e0._16_4_;
      auVar49._16_4_ = auVar150._16_4_ * fVar23;
      fVar26 = local_14e0._20_4_;
      auVar49._20_4_ = auVar150._20_4_ * fVar26;
      fVar29 = local_14e0._24_4_;
      auVar49._24_4_ = auVar150._24_4_ * fVar29;
      auVar49._28_4_ = fVar111;
      auVar82 = vfmsub231ps_fma(auVar49,local_14c0,auVar94);
      auVar35 = vsubps_avx(local_17a0,auVar73);
      fVar101 = auVar35._0_4_;
      fVar104 = auVar35._4_4_;
      auVar50._4_4_ = auVar94._4_4_ * fVar104;
      auVar50._0_4_ = auVar94._0_4_ * fVar101;
      fVar18 = auVar35._8_4_;
      auVar50._8_4_ = auVar94._8_4_ * fVar18;
      fVar21 = auVar35._12_4_;
      auVar50._12_4_ = auVar94._12_4_ * fVar21;
      fVar24 = auVar35._16_4_;
      auVar50._16_4_ = auVar94._16_4_ * fVar24;
      fVar27 = auVar35._20_4_;
      auVar50._20_4_ = auVar94._20_4_ * fVar27;
      fVar30 = auVar35._24_4_;
      auVar50._24_4_ = auVar94._24_4_ * fVar30;
      auVar50._28_4_ = auVar94._28_4_;
      auVar122._0_4_ = local_17a0._0_4_ + auVar73._0_4_;
      auVar122._4_4_ = local_17a0._4_4_ + auVar73._4_4_;
      auVar122._8_4_ = local_17a0._8_4_ + auVar73._8_4_;
      auVar122._12_4_ = local_17a0._12_4_ + auVar73._12_4_;
      auVar122._16_4_ = local_17a0._16_4_ + auVar73._16_4_;
      auVar122._20_4_ = local_17a0._20_4_ + auVar73._20_4_;
      auVar122._24_4_ = local_17a0._24_4_ + auVar73._24_4_;
      auVar122._28_4_ = local_17a0._28_4_ + auVar73._28_4_;
      auVar76 = vfmsub231ps_fma(auVar50,local_14e0,auVar122);
      fVar102 = local_14c0._0_4_;
      fVar105 = local_14c0._4_4_;
      auVar51._4_4_ = auVar122._4_4_ * fVar105;
      auVar51._0_4_ = auVar122._0_4_ * fVar102;
      fVar19 = local_14c0._8_4_;
      auVar51._8_4_ = auVar122._8_4_ * fVar19;
      fVar22 = local_14c0._12_4_;
      auVar51._12_4_ = auVar122._12_4_ * fVar22;
      fVar25 = local_14c0._16_4_;
      auVar51._16_4_ = auVar122._16_4_ * fVar25;
      fVar28 = local_14c0._20_4_;
      auVar51._20_4_ = auVar122._20_4_ * fVar28;
      fVar31 = local_14c0._24_4_;
      auVar51._24_4_ = auVar122._24_4_ * fVar31;
      auVar51._28_4_ = local_14e0._28_4_;
      auVar38 = vfmsub231ps_fma(auVar51,auVar35,auVar150);
      auVar114._0_4_ = auVar38._0_4_ * local_14a0;
      auVar114._4_4_ = auVar38._4_4_ * local_14a0;
      auVar114._8_4_ = auVar38._8_4_ * local_14a0;
      auVar114._12_4_ = auVar38._12_4_ * local_14a0;
      auVar114._16_4_ = local_14a0 * 0.0;
      auVar114._20_4_ = local_14a0 * 0.0;
      auVar114._24_4_ = local_14a0 * 0.0;
      auVar114._28_4_ = 0;
      auVar76 = vfmadd231ps_fma(auVar114,auVar130,ZEXT1632(auVar76));
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_1480,ZEXT1632(auVar82));
      auVar36 = vsubps_avx(auVar73,auVar32);
      auVar88._0_4_ = auVar73._0_4_ + auVar32._0_4_;
      auVar88._4_4_ = auVar73._4_4_ + auVar32._4_4_;
      auVar88._8_4_ = auVar73._8_4_ + auVar32._8_4_;
      auVar88._12_4_ = auVar73._12_4_ + auVar32._12_4_;
      auVar88._16_4_ = auVar73._16_4_ + auVar32._16_4_;
      auVar88._20_4_ = auVar73._20_4_ + auVar32._20_4_;
      auVar88._24_4_ = auVar73._24_4_ + auVar32._24_4_;
      auVar88._28_4_ = auVar73._28_4_ + auVar32._28_4_;
      auVar32 = vsubps_avx(auVar83,auVar33);
      auVar100._0_4_ = auVar83._0_4_ + auVar33._0_4_;
      auVar100._4_4_ = auVar83._4_4_ + auVar33._4_4_;
      auVar100._8_4_ = auVar83._8_4_ + auVar33._8_4_;
      auVar100._12_4_ = auVar83._12_4_ + auVar33._12_4_;
      auVar100._16_4_ = auVar83._16_4_ + auVar33._16_4_;
      auVar100._20_4_ = auVar83._20_4_ + auVar33._20_4_;
      auVar100._24_4_ = auVar83._24_4_ + auVar33._24_4_;
      auVar100._28_4_ = auVar83._28_4_ + auVar33._28_4_;
      auVar33 = vsubps_avx(auVar81,auVar34);
      auVar78._0_4_ = auVar81._0_4_ + auVar34._0_4_;
      auVar78._4_4_ = auVar81._4_4_ + auVar34._4_4_;
      auVar78._8_4_ = auVar81._8_4_ + auVar34._8_4_;
      auVar78._12_4_ = auVar81._12_4_ + auVar34._12_4_;
      auVar78._16_4_ = auVar81._16_4_ + auVar34._16_4_;
      auVar78._20_4_ = auVar81._20_4_ + auVar34._20_4_;
      auVar78._24_4_ = auVar81._24_4_ + auVar34._24_4_;
      auVar78._28_4_ = fVar116 + auVar34._28_4_;
      auVar52._4_4_ = auVar33._4_4_ * auVar100._4_4_;
      auVar52._0_4_ = auVar33._0_4_ * auVar100._0_4_;
      auVar52._8_4_ = auVar33._8_4_ * auVar100._8_4_;
      auVar52._12_4_ = auVar33._12_4_ * auVar100._12_4_;
      auVar52._16_4_ = auVar33._16_4_ * auVar100._16_4_;
      auVar52._20_4_ = auVar33._20_4_ * auVar100._20_4_;
      auVar52._24_4_ = auVar33._24_4_ * auVar100._24_4_;
      auVar52._28_4_ = fVar116;
      auVar38 = vfmsub231ps_fma(auVar52,auVar32,auVar78);
      auVar53._4_4_ = auVar78._4_4_ * auVar36._4_4_;
      auVar53._0_4_ = auVar78._0_4_ * auVar36._0_4_;
      auVar53._8_4_ = auVar78._8_4_ * auVar36._8_4_;
      auVar53._12_4_ = auVar78._12_4_ * auVar36._12_4_;
      auVar53._16_4_ = auVar78._16_4_ * auVar36._16_4_;
      auVar53._20_4_ = auVar78._20_4_ * auVar36._20_4_;
      auVar53._24_4_ = auVar78._24_4_ * auVar36._24_4_;
      auVar53._28_4_ = auVar78._28_4_;
      auVar82 = vfmsub231ps_fma(auVar53,auVar33,auVar88);
      auVar54._4_4_ = auVar32._4_4_ * auVar88._4_4_;
      auVar54._0_4_ = auVar32._0_4_ * auVar88._0_4_;
      auVar54._8_4_ = auVar32._8_4_ * auVar88._8_4_;
      auVar54._12_4_ = auVar32._12_4_ * auVar88._12_4_;
      auVar54._16_4_ = auVar32._16_4_ * auVar88._16_4_;
      auVar54._20_4_ = auVar32._20_4_ * auVar88._20_4_;
      auVar54._24_4_ = auVar32._24_4_ * auVar88._24_4_;
      auVar54._28_4_ = auVar88._28_4_;
      auVar39 = vfmsub231ps_fma(auVar54,auVar36,auVar100);
      auVar89._0_4_ = local_14a0 * auVar39._0_4_;
      auVar89._4_4_ = local_14a0 * auVar39._4_4_;
      auVar89._8_4_ = local_14a0 * auVar39._8_4_;
      auVar89._12_4_ = local_14a0 * auVar39._12_4_;
      auVar89._16_4_ = local_14a0 * 0.0;
      auVar89._20_4_ = local_14a0 * 0.0;
      auVar89._24_4_ = local_14a0 * 0.0;
      auVar89._28_4_ = 0;
      auVar82 = vfmadd231ps_fma(auVar89,auVar130,ZEXT1632(auVar82));
      auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_1480,ZEXT1632(auVar38));
      local_13a0 = ZEXT1632(auVar76);
      local_13c0 = auVar37._0_4_;
      fStack_13bc = auVar37._4_4_;
      fStack_13b8 = auVar37._8_4_;
      fStack_13b4 = auVar37._12_4_;
      local_1380 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar76._12_4_ + fStack_13b4,
                                      CONCAT48(auVar82._8_4_ + auVar76._8_4_ + fStack_13b8,
                                               CONCAT44(auVar82._4_4_ + auVar76._4_4_ + fStack_13bc,
                                                        auVar82._0_4_ + auVar76._0_4_ + local_13c0))
                                     ));
      auVar79._8_4_ = 0x7fffffff;
      auVar79._0_8_ = 0x7fffffff7fffffff;
      auVar79._12_4_ = 0x7fffffff;
      auVar79._16_4_ = 0x7fffffff;
      auVar79._20_4_ = 0x7fffffff;
      auVar79._24_4_ = 0x7fffffff;
      auVar79._28_4_ = 0x7fffffff;
      auVar73 = vminps_avx(ZEXT1632(auVar37),local_13a0);
      auVar73 = vminps_avx(auVar73,ZEXT1632(auVar82));
      local_1520 = vandps_avx(local_1380,auVar79);
      fVar111 = local_1520._0_4_ * 1.1920929e-07;
      fVar116 = local_1520._4_4_ * 1.1920929e-07;
      auVar55._4_4_ = fVar116;
      auVar55._0_4_ = fVar111;
      fVar117 = local_1520._8_4_ * 1.1920929e-07;
      auVar55._8_4_ = fVar117;
      fVar118 = local_1520._12_4_ * 1.1920929e-07;
      auVar55._12_4_ = fVar118;
      fVar119 = local_1520._16_4_ * 1.1920929e-07;
      auVar55._16_4_ = fVar119;
      fVar120 = local_1520._20_4_ * 1.1920929e-07;
      auVar55._20_4_ = fVar120;
      fVar121 = local_1520._24_4_ * 1.1920929e-07;
      auVar55._24_4_ = fVar121;
      auVar55._28_4_ = 0x34000000;
      auVar107._0_8_ = CONCAT44(fVar116,fVar111) ^ 0x8000000080000000;
      auVar107._8_4_ = -fVar117;
      auVar107._12_4_ = -fVar118;
      auVar107._16_4_ = -fVar119;
      auVar107._20_4_ = -fVar120;
      auVar107._24_4_ = -fVar121;
      auVar107._28_4_ = 0xb4000000;
      auVar73 = vcmpps_avx(auVar73,auVar107,5);
      local_1500 = ZEXT1632(auVar37);
      auVar81 = vmaxps_avx(local_1500,local_13a0);
      auVar83 = vmaxps_avx(auVar81,ZEXT1632(auVar82));
      auVar83 = vcmpps_avx(auVar83,auVar55,2);
      auVar83 = vorps_avx(auVar73,auVar83);
      fVar121 = fStack_16dc;
      fVar124 = fStack_16d8;
      fVar125 = fStack_16d4;
      fVar126 = fStack_16d0;
      fVar127 = fStack_16cc;
      fVar128 = fStack_16c8;
      fVar118 = local_16e0;
      fVar131 = fStack_16fc;
      fVar132 = fStack_16f8;
      fVar133 = fStack_16f4;
      fVar134 = fStack_16f0;
      fVar135 = fStack_16ec;
      fVar136 = fStack_16e8;
      fVar119 = local_1700;
      fVar137 = fStack_171c;
      fVar138 = fStack_1718;
      fVar139 = fStack_1714;
      fVar140 = fStack_1710;
      fVar141 = fStack_170c;
      fVar142 = fStack_1708;
      fVar120 = local_1720;
      fVar144 = fStack_173c;
      fVar145 = fStack_1738;
      fVar146 = fStack_1734;
      fVar147 = fStack_1730;
      fVar148 = fStack_172c;
      fVar149 = fStack_1728;
      fVar111 = local_1740;
      fVar151 = fStack_175c;
      fVar152 = fStack_1758;
      fVar153 = fStack_1754;
      fVar154 = fStack_1750;
      fVar155 = fStack_174c;
      fVar156 = fStack_1748;
      fVar116 = local_1760;
      fVar158 = fStack_177c;
      fVar159 = fStack_1778;
      fVar160 = fStack_1774;
      fVar161 = fStack_1770;
      fVar162 = fStack_176c;
      fVar163 = fStack_1768;
      fVar117 = local_1780;
      if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar83 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar83 >> 0x7f,0) == '\0') &&
            (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar83 >> 0xbf,0) == '\0') &&
          (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar83[0x1f])
      {
LAB_0167f563:
        auVar108 = ZEXT3264(local_1680);
        auVar110 = ZEXT3264(local_16a0);
        auVar115 = ZEXT3264(local_16c0);
        auVar91 = ZEXT3264(local_1640);
        auVar96 = ZEXT3264(local_1660);
      }
      else {
        auVar56._4_4_ = fVar105 * local_1440._4_4_;
        auVar56._0_4_ = fVar102 * local_1440._0_4_;
        auVar56._8_4_ = fVar19 * local_1440._8_4_;
        auVar56._12_4_ = fVar22 * local_1440._12_4_;
        auVar56._16_4_ = fVar25 * local_1440._16_4_;
        auVar56._20_4_ = fVar28 * local_1440._20_4_;
        auVar56._24_4_ = fVar31 * local_1440._24_4_;
        auVar56._28_4_ = auVar73._28_4_;
        auVar57._4_4_ = local_1460._4_4_ * fVar104;
        auVar57._0_4_ = local_1460._0_4_ * fVar101;
        auVar57._8_4_ = local_1460._8_4_ * fVar18;
        auVar57._12_4_ = local_1460._12_4_ * fVar21;
        auVar57._16_4_ = local_1460._16_4_ * fVar24;
        auVar57._20_4_ = local_1460._20_4_ * fVar27;
        auVar57._24_4_ = local_1460._24_4_ * fVar30;
        auVar57._28_4_ = 0x34000000;
        auVar37 = vfmsub213ps_fma(local_1460,local_14e0,auVar56);
        auVar58._4_4_ = auVar32._4_4_ * fVar103;
        auVar58._0_4_ = auVar32._0_4_ * fVar97;
        auVar58._8_4_ = auVar32._8_4_ * fVar106;
        auVar58._12_4_ = auVar32._12_4_ * fVar20;
        auVar58._16_4_ = auVar32._16_4_ * fVar23;
        auVar58._20_4_ = auVar32._20_4_ * fVar26;
        auVar58._24_4_ = auVar32._24_4_ * fVar29;
        auVar58._28_4_ = auVar81._28_4_;
        auVar59._4_4_ = auVar33._4_4_ * fVar104;
        auVar59._0_4_ = auVar33._0_4_ * fVar101;
        auVar59._8_4_ = auVar33._8_4_ * fVar18;
        auVar59._12_4_ = auVar33._12_4_ * fVar21;
        auVar59._16_4_ = auVar33._16_4_ * fVar24;
        auVar59._20_4_ = auVar33._20_4_ * fVar27;
        auVar59._24_4_ = auVar33._24_4_ * fVar30;
        auVar59._28_4_ = local_1520._28_4_;
        auVar82 = vfmsub213ps_fma(auVar33,local_14c0,auVar58);
        auVar73 = vandps_avx(auVar56,auVar79);
        auVar81 = vandps_avx(auVar58,auVar79);
        auVar73 = vcmpps_avx(auVar73,auVar81,1);
        local_1360 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar37),auVar73);
        auVar60._4_4_ = fVar105 * auVar36._4_4_;
        auVar60._0_4_ = fVar102 * auVar36._0_4_;
        auVar60._8_4_ = fVar19 * auVar36._8_4_;
        auVar60._12_4_ = fVar22 * auVar36._12_4_;
        auVar60._16_4_ = fVar25 * auVar36._16_4_;
        auVar60._20_4_ = fVar28 * auVar36._20_4_;
        auVar60._24_4_ = fVar31 * auVar36._24_4_;
        auVar60._28_4_ = auVar73._28_4_;
        auVar37 = vfmsub213ps_fma(auVar36,local_14e0,auVar59);
        auVar61._4_4_ = local_1420._4_4_ * fVar103;
        auVar61._0_4_ = local_1420._0_4_ * fVar97;
        auVar61._8_4_ = local_1420._8_4_ * fVar106;
        auVar61._12_4_ = local_1420._12_4_ * fVar20;
        auVar61._16_4_ = local_1420._16_4_ * fVar23;
        auVar61._20_4_ = local_1420._20_4_ * fVar26;
        auVar61._24_4_ = local_1420._24_4_ * fVar29;
        auVar61._28_4_ = auVar81._28_4_;
        auVar82 = vfmsub213ps_fma(local_1440,auVar35,auVar61);
        auVar73 = vandps_avx(auVar61,auVar79);
        auVar81 = vandps_avx(auVar59,auVar79);
        auVar73 = vcmpps_avx(auVar73,auVar81,1);
        local_1340 = vblendvps_avx(ZEXT1632(auVar37),ZEXT1632(auVar82),auVar73);
        auVar37 = vfmsub213ps_fma(local_1420,local_14c0,auVar57);
        auVar82 = vfmsub213ps_fma(auVar32,auVar35,auVar60);
        auVar73 = vandps_avx(auVar57,auVar79);
        auVar81 = vandps_avx(auVar60,auVar79);
        auVar73 = vcmpps_avx(auVar73,auVar81,1);
        local_1320 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar37),auVar73);
        auVar37 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        fVar97 = local_1320._0_4_;
        auVar80._0_4_ = fVar97 * local_14a0;
        fVar101 = local_1320._4_4_;
        auVar80._4_4_ = fVar101 * local_14a0;
        fVar102 = local_1320._8_4_;
        auVar80._8_4_ = fVar102 * local_14a0;
        fVar103 = local_1320._12_4_;
        auVar80._12_4_ = fVar103 * local_14a0;
        fVar104 = local_1320._16_4_;
        auVar80._16_4_ = fVar104 * local_14a0;
        fVar105 = local_1320._20_4_;
        auVar80._20_4_ = fVar105 * local_14a0;
        fVar106 = local_1320._24_4_;
        auVar80._24_4_ = fVar106 * local_14a0;
        auVar80._28_4_ = 0;
        auVar82 = vfmadd213ps_fma(auVar130,local_1340,auVar80);
        auVar82 = vfmadd213ps_fma(local_1480,local_1360,ZEXT1632(auVar82));
        auVar81 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                     CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                              CONCAT44(auVar82._4_4_ + auVar82._4_4_,
                                                       auVar82._0_4_ + auVar82._0_4_))));
        auVar62._4_4_ = fVar101 * fVar12;
        auVar62._0_4_ = fVar97 * fVar11;
        auVar62._8_4_ = fVar102 * fVar13;
        auVar62._12_4_ = fVar103 * fVar14;
        auVar62._16_4_ = fVar104 * fVar15;
        auVar62._20_4_ = fVar105 * fVar16;
        auVar62._24_4_ = fVar106 * fVar17;
        auVar62._28_4_ = auVar83._28_4_;
        auVar82 = vfmadd213ps_fma(auVar43,local_1340,auVar62);
        auVar38 = vfmadd213ps_fma(local_17a0,local_1360,ZEXT1632(auVar82));
        auVar73 = vrcpps_avx(auVar81);
        auVar123._8_4_ = 0x3f800000;
        auVar123._0_8_ = 0x3f8000003f800000;
        auVar123._12_4_ = 0x3f800000;
        auVar123._16_4_ = 0x3f800000;
        auVar123._20_4_ = 0x3f800000;
        auVar123._24_4_ = 0x3f800000;
        auVar123._28_4_ = 0x3f800000;
        auVar82 = vfnmadd213ps_fma(auVar73,auVar81,auVar123);
        auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar73,auVar73);
        local_12a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * (auVar38._12_4_ + auVar38._12_4_),
                                        CONCAT48(auVar82._8_4_ * (auVar38._8_4_ + auVar38._8_4_),
                                                 CONCAT44(auVar82._4_4_ *
                                                          (auVar38._4_4_ + auVar38._4_4_),
                                                          auVar82._0_4_ *
                                                          (auVar38._0_4_ + auVar38._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar109._16_4_ = uVar1;
        auVar109._20_4_ = uVar1;
        auVar109._24_4_ = uVar1;
        auVar109._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1620._4_4_ = uVar1;
        local_1620._0_4_ = uVar1;
        local_1620._8_4_ = uVar1;
        local_1620._12_4_ = uVar1;
        local_1620._16_4_ = uVar1;
        local_1620._20_4_ = uVar1;
        local_1620._24_4_ = uVar1;
        local_1620._28_4_ = uVar1;
        auVar73 = vcmpps_avx(auVar109,local_12a0,2);
        auVar83 = vcmpps_avx(local_12a0,local_1620,2);
        auVar73 = vandps_avx(auVar73,auVar83);
        auVar82 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
        auVar37 = vpand_avx(auVar82,auVar37);
        auVar73 = vpmovsxwd_avx2(auVar37);
        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar73 >> 0x7f,0) == '\0') &&
              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar73 >> 0xbf,0) == '\0') &&
            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar73[0x1f]) goto LAB_0167f563;
        auVar73 = vcmpps_avx(auVar81,_DAT_01f7b000,4);
        auVar82 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
        auVar37 = vpand_avx(auVar37,auVar82);
        local_1300 = vpmovsxwd_avx2(auVar37);
        if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0x7f,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_1300 >> 0xbf,0) == '\0') &&
            (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_1300[0x1f]) goto LAB_0167f563;
        uStack_13b0 = 0;
        uStack_13ac = 0;
        uStack_13a8 = 0;
        uStack_13a4 = 0;
        local_1220 = local_1540;
        auVar73 = vrcpps_avx(local_1380);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = 0x3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar95._16_4_ = 0x3f800000;
        auVar95._20_4_ = 0x3f800000;
        auVar95._24_4_ = 0x3f800000;
        auVar95._28_4_ = 0x3f800000;
        auVar82 = vfnmadd213ps_fma(local_1380,auVar73,auVar95);
        auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar73,auVar73);
        auVar90._8_4_ = 0x219392ef;
        auVar90._0_8_ = 0x219392ef219392ef;
        auVar90._12_4_ = 0x219392ef;
        auVar90._16_4_ = 0x219392ef;
        auVar90._20_4_ = 0x219392ef;
        auVar90._24_4_ = 0x219392ef;
        auVar90._28_4_ = 0x219392ef;
        auVar73 = vcmpps_avx(local_1520,auVar90,5);
        auVar73 = vandps_avx(auVar73,ZEXT1632(auVar82));
        auVar63._4_4_ = fStack_13bc * auVar73._4_4_;
        auVar63._0_4_ = local_13c0 * auVar73._0_4_;
        auVar63._8_4_ = fStack_13b8 * auVar73._8_4_;
        auVar63._12_4_ = fStack_13b4 * auVar73._12_4_;
        auVar63._16_4_ = auVar73._16_4_ * 0.0;
        auVar63._20_4_ = auVar73._20_4_ * 0.0;
        auVar63._24_4_ = auVar73._24_4_ * 0.0;
        auVar63._28_4_ = 0;
        auVar83 = vminps_avx(auVar63,auVar95);
        auVar64._4_4_ = auVar76._4_4_ * auVar73._4_4_;
        auVar64._0_4_ = auVar76._0_4_ * auVar73._0_4_;
        auVar64._8_4_ = auVar76._8_4_ * auVar73._8_4_;
        auVar64._12_4_ = auVar76._12_4_ * auVar73._12_4_;
        auVar64._16_4_ = auVar73._16_4_ * 0.0;
        auVar64._20_4_ = auVar73._20_4_ * 0.0;
        auVar64._24_4_ = auVar73._24_4_ * 0.0;
        auVar64._28_4_ = auVar35._28_4_;
        auVar73 = vminps_avx(auVar64,auVar95);
        auVar81 = vsubps_avx(auVar95,auVar83);
        auVar43 = vsubps_avx(auVar95,auVar73);
        local_12c0 = vblendvps_avx(auVar73,auVar81,local_1540);
        local_12e0 = vblendvps_avx(auVar83,auVar43,local_1540);
        local_1260._4_4_ = (float)local_1560._4_4_ * local_1340._4_4_;
        local_1260._0_4_ = (float)local_1560._0_4_ * local_1340._0_4_;
        local_1260._8_4_ = fStack_1558 * local_1340._8_4_;
        local_1260._12_4_ = fStack_1554 * local_1340._12_4_;
        local_1260._16_4_ = fStack_1550 * local_1340._16_4_;
        local_1260._20_4_ = fStack_154c * local_1340._20_4_;
        local_1260._24_4_ = fStack_1548 * local_1340._24_4_;
        local_1260._28_4_ = local_12c0._28_4_;
        local_1280[0] = local_1360._0_4_ * (float)local_1560._0_4_;
        local_1280[1] = local_1360._4_4_ * (float)local_1560._4_4_;
        local_1280[2] = local_1360._8_4_ * fStack_1558;
        local_1280[3] = local_1360._12_4_ * fStack_1554;
        fStack_1270 = local_1360._16_4_ * fStack_1550;
        fStack_126c = local_1360._20_4_ * fStack_154c;
        fStack_1268 = local_1360._24_4_ * fStack_1548;
        uStack_1264 = local_12e0._28_4_;
        local_1240[0] = (float)local_1560._0_4_ * fVar97;
        local_1240[1] = (float)local_1560._4_4_ * fVar101;
        local_1240[2] = fStack_1558 * fVar102;
        local_1240[3] = fStack_1554 * fVar103;
        fStack_1230 = fStack_1550 * fVar104;
        fStack_122c = fStack_154c * fVar105;
        fStack_1228 = fStack_1548 * fVar106;
        uStack_1224 = uStack_1544;
        auVar37 = vpacksswb_avx(auVar37,auVar37);
        uVar66 = (ulong)(byte)(SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar37 >> 0x37,0) & 1) << 6 | SUB161(auVar37 >> 0x3f,0) << 7
                              );
        auVar108 = ZEXT3264(local_1680);
        auVar110 = ZEXT3264(local_16a0);
        auVar115 = ZEXT3264(local_16c0);
        auVar91 = ZEXT3264(local_1640);
        auVar96 = ZEXT3264(local_1660);
        fStack_149c = local_14a0;
        fStack_1498 = local_14a0;
        fStack_1494 = local_14a0;
        fStack_1490 = local_14a0;
        fStack_148c = local_14a0;
        fStack_1488 = local_14a0;
        fStack_1484 = local_14a0;
        do {
          uVar68 = 0;
          for (uVar45 = uVar66; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
            uVar68 = uVar68 + 1;
          }
          uVar65 = *(uint *)((long)&local_13e0 + uVar68 * 4);
          pGVar9 = (pSVar3->geometries).items[uVar65].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_17a0._0_8_ = uVar68;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_17c0._0_8_ = uVar66;
              uVar66 = (ulong)(uint)((int)uVar68 * 4);
              local_15c0 = *(undefined4 *)(local_12e0 + uVar66);
              uVar1 = *(undefined4 *)(local_12c0 + uVar66);
              local_15b0._4_4_ = uVar1;
              local_15b0._0_4_ = uVar1;
              local_15b0._8_4_ = uVar1;
              local_15b0._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar66);
              local_17f0.context = context->user;
              local_1590._4_4_ = uVar65;
              local_1590._0_4_ = uVar65;
              local_1590._8_4_ = uVar65;
              local_1590._12_4_ = uVar65;
              local_15a0 = *(undefined4 *)((long)&local_1400 + uVar66);
              local_15f0 = *(undefined4 *)((long)local_1280 + uVar66);
              uVar1 = *(undefined4 *)(local_1260 + uVar66);
              local_15e0._4_4_ = uVar1;
              local_15e0._0_4_ = uVar1;
              local_15e0._8_4_ = uVar1;
              local_15e0._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1240 + uVar66);
              local_15d0._4_4_ = uVar1;
              local_15d0._0_4_ = uVar1;
              local_15d0._8_4_ = uVar1;
              local_15d0._12_4_ = uVar1;
              vpcmpeqd_avx2(ZEXT1632(local_1590),ZEXT1632(local_1590));
              uStack_157c = (local_17f0.context)->instID[0];
              local_1580 = uStack_157c;
              uStack_1578 = uStack_157c;
              uStack_1574 = uStack_157c;
              uStack_1570 = (local_17f0.context)->instPrimID[0];
              uStack_156c = uStack_1570;
              uStack_1568 = uStack_1570;
              uStack_1564 = uStack_1570;
              local_1820 = *local_1810;
              local_17f0.valid = (int *)local_1820;
              local_17f0.geometryUserPtr = pGVar9->userPtr;
              local_17f0.hit = (RTCHitN *)&local_15f0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_15ec = local_15f0;
              uStack_15e8 = local_15f0;
              uStack_15e4 = local_15f0;
              uStack_15bc = local_15c0;
              uStack_15b8 = local_15c0;
              uStack_15b4 = local_15c0;
              uStack_159c = local_15a0;
              uStack_1598 = local_15a0;
              uStack_1594 = local_15a0;
              if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->occlusionFilterN)(&local_17f0);
                auVar115 = ZEXT3264(local_16c0);
                auVar110 = ZEXT3264(local_16a0);
                auVar108 = ZEXT3264(local_1680);
                fVar118 = local_16e0;
                fVar121 = fStack_16dc;
                fVar124 = fStack_16d8;
                fVar125 = fStack_16d4;
                fVar126 = fStack_16d0;
                fVar127 = fStack_16cc;
                fVar128 = fStack_16c8;
                fVar119 = local_1700;
                fVar131 = fStack_16fc;
                fVar132 = fStack_16f8;
                fVar133 = fStack_16f4;
                fVar134 = fStack_16f0;
                fVar135 = fStack_16ec;
                fVar136 = fStack_16e8;
                fVar120 = local_1720;
                fVar137 = fStack_171c;
                fVar138 = fStack_1718;
                fVar139 = fStack_1714;
                fVar140 = fStack_1710;
                fVar141 = fStack_170c;
                fVar142 = fStack_1708;
                fVar111 = local_1740;
                fVar144 = fStack_173c;
                fVar145 = fStack_1738;
                fVar146 = fStack_1734;
                fVar147 = fStack_1730;
                fVar148 = fStack_172c;
                fVar149 = fStack_1728;
                fVar116 = local_1760;
                fVar151 = fStack_175c;
                fVar152 = fStack_1758;
                fVar153 = fStack_1754;
                fVar154 = fStack_1750;
                fVar155 = fStack_174c;
                fVar156 = fStack_1748;
                fVar117 = local_1780;
                fVar158 = fStack_177c;
                fVar159 = fStack_1778;
                fVar160 = fStack_1774;
                fVar161 = fStack_1770;
                fVar162 = fStack_176c;
                fVar163 = fStack_1768;
              }
              if (local_1820 == (undefined1  [16])0x0) {
                auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar37 = auVar37 ^ _DAT_01f46b70;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var10)(&local_17f0);
                  auVar115 = ZEXT3264(local_16c0);
                  auVar110 = ZEXT3264(local_16a0);
                  auVar108 = ZEXT3264(local_1680);
                  fVar118 = local_16e0;
                  fVar121 = fStack_16dc;
                  fVar124 = fStack_16d8;
                  fVar125 = fStack_16d4;
                  fVar126 = fStack_16d0;
                  fVar127 = fStack_16cc;
                  fVar128 = fStack_16c8;
                  fVar119 = local_1700;
                  fVar131 = fStack_16fc;
                  fVar132 = fStack_16f8;
                  fVar133 = fStack_16f4;
                  fVar134 = fStack_16f0;
                  fVar135 = fStack_16ec;
                  fVar136 = fStack_16e8;
                  fVar120 = local_1720;
                  fVar137 = fStack_171c;
                  fVar138 = fStack_1718;
                  fVar139 = fStack_1714;
                  fVar140 = fStack_1710;
                  fVar141 = fStack_170c;
                  fVar142 = fStack_1708;
                  fVar111 = local_1740;
                  fVar144 = fStack_173c;
                  fVar145 = fStack_1738;
                  fVar146 = fStack_1734;
                  fVar147 = fStack_1730;
                  fVar148 = fStack_172c;
                  fVar149 = fStack_1728;
                  fVar116 = local_1760;
                  fVar151 = fStack_175c;
                  fVar152 = fStack_1758;
                  fVar153 = fStack_1754;
                  fVar154 = fStack_1750;
                  fVar155 = fStack_174c;
                  fVar156 = fStack_1748;
                  fVar117 = local_1780;
                  fVar158 = fStack_177c;
                  fVar159 = fStack_1778;
                  fVar160 = fStack_1774;
                  fVar161 = fStack_1770;
                  fVar162 = fStack_176c;
                  fVar163 = fStack_1768;
                }
                auVar76 = vpcmpeqd_avx(local_1820,_DAT_01f45a50);
                auVar37 = auVar76 ^ _DAT_01f46b70;
                auVar82._8_4_ = 0xff800000;
                auVar82._0_8_ = 0xff800000ff800000;
                auVar82._12_4_ = 0xff800000;
                auVar76 = vblendvps_avx(auVar82,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar76);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar76;
              }
              auVar91 = ZEXT3264(local_1640);
              auVar96 = ZEXT3264(local_1660);
              auVar76._8_8_ = 0x100000001;
              auVar76._0_8_ = 0x100000001;
              if ((auVar76 & auVar37) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = local_1620._0_4_;
                uVar66 = local_17c0._0_8_ ^ 1L << (local_17a0._0_8_ & 0x3f);
                goto LAB_0167f4f6;
              }
            }
            *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
            goto LAB_0167f606;
          }
          uVar66 = uVar66 ^ 1L << (uVar68 & 0x3f);
LAB_0167f4f6:
        } while (uVar66 != 0);
      }
    }
LAB_0167f5db:
    local_1868 = local_1870;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }